

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

Value __thiscall jbcoin::STObject::getJson(STObject *this,int options)

{
  bool bVar1;
  int iVar2;
  vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_> *this_00;
  reference this_01;
  STBase *pSVar3;
  string *psVar4;
  Value *this_02;
  uint in_EDX;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  Value VVar5;
  Value local_90;
  undefined1 local_80 [8];
  string key;
  SField *n;
  STVar *elem;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  int index;
  int options_local;
  STObject *this_local;
  Value *ret;
  
  Json::Value::Value((Value *)this,objectValue);
  this_00 = (vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_> *)
            (CONCAT44(in_register_00000034,options) + 0x10);
  __end1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                     (this_00);
  elem = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::end
                            (this_00);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                     *)&elem), bVar1) {
    this_01 = __gnu_cxx::
              __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
              ::operator*(&__end1);
    pSVar3 = jbcoin::detail::STVar::operator->(this_01);
    iVar2 = (*pSVar3->_vptr_STBase[4])();
    if (iVar2 != 0) {
      pSVar3 = jbcoin::detail::STVar::operator->(this_01);
      key.field_2._8_8_ = STBase::getFName(pSVar3);
      bVar1 = SField::hasName((SField *)key.field_2._8_8_);
      if (bVar1) {
        psVar4 = SField::getJsonName_abi_cxx11_((SField *)key.field_2._8_8_);
        std::__cxx11::string::string((string *)local_80,(string *)psVar4);
      }
      else {
        std::__cxx11::to_string((string *)local_80,1);
      }
      pSVar3 = jbcoin::detail::STVar::operator->(this_01);
      (*pSVar3->_vptr_STBase[7])(&local_90,pSVar3,(ulong)in_EDX);
      this_02 = Json::Value::operator[]((Value *)this,(string *)local_80);
      Json::Value::operator=(this_02,&local_90);
      Json::Value::~Value(&local_90);
      std::__cxx11::string::~string((string *)local_80);
    }
    __gnu_cxx::
    __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
    ::operator++(&__end1);
  }
  VVar5._8_8_ = extraout_RDX;
  VVar5.value_.map_ = (ObjectValues *)this;
  return VVar5;
}

Assistant:

Json::Value STObject::getJson (int options) const
{
    Json::Value ret (Json::objectValue);

    // TODO(tom): this variable is never changed...?
    int index = 1;
    for (auto const& elem : v_)
    {
        if (elem->getSType () != STI_NOTPRESENT)
        {
            auto const& n = elem->getFName ();
            auto key = n.hasName () ? std::string(n.getJsonName ()) :
                    std::to_string (index);
            ret[key] = elem->getJson (options);
        }
    }
    return ret;
}